

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O2

PipelineResourceSignatureImplType * __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::GetResourceSignature
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this,Uint32 Index)

{
  char (*in_RCX) [25];
  string msg;
  string local_38;
  
  CheckPipelineReady(this);
  if (this->m_SignatureCount <= Index) {
    FormatString<char[26],char[25]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Index < m_SignatureCount",in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetResourceSignature",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x2d7);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return this->m_Signatures[Index].m_pObject;
}

Assistant:

GetResourceSignature(Uint32 Index) const override final
    {
        CheckPipelineReady();
        VERIFY_EXPR(Index < m_SignatureCount);
        return m_Signatures[Index];
    }